

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

string * __thiscall embree::Camera::str_abi_cxx11_(string *__return_storage_ptr__,Camera *this)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream stream;
  long local_1a0;
  undefined8 uStack_198;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a0 + -0x18)) = 10;
  poVar1 = std::operator<<(local_190,"--vp ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->from).field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->from).field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->from).field_0.m128[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--vi ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->to).field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->to).field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->to).field_0.m128[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--vu ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->up).field_0.m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->up).field_0.m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->up).field_0.m128[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--fov ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->fov);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "--righthanded";
  if (this->handedness == LEFT_HANDED) {
    pcVar2 = "--lefthanded";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const 
    {
      std::stringstream stream;
      stream.precision(10);
      stream << "--vp " << from.x    << " " << from.y    << " " << from.z    << " " 
             << "--vi " << to.x << " " << to.y << " " << to.z << " " 
             << "--vu " << up.x     << " " << up.y     << " " << up.z     << " " 
             << "--fov " << fov << " "
             << (handedness == LEFT_HANDED ? "--lefthanded" : "--righthanded");
      return stream.str();
    }